

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterValidator.cpp
# Opt level: O0

Result * CoreML::validateInt64Parameter
                   (Result *__return_storage_ptr__,string *parameterName,
                   Int64Parameter *int64Parameter,bool shouldBePositive)

{
  string *psVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  Int64Set *this;
  RepeatedField<long> *this_00;
  const_iterator plVar5;
  int64 iVar6;
  int64 iVar7;
  string local_4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  undefined1 local_448 [8];
  string err_6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  undefined1 local_3a8 [8];
  string err_5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  undefined1 local_308 [8];
  string err_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  undefined1 local_268 [8];
  string err_3;
  Int64Range *range;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  undefined1 local_1c0 [8];
  string err_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  undefined1 local_120 [8];
  string err_1;
  long *value;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedField<long> *__range2;
  bool valueFoundInSet;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_50 [8];
  string err;
  int64 defaultValue;
  bool shouldBePositive_local;
  Int64Parameter *int64Parameter_local;
  string *parameterName_local;
  
  err.field_2._8_8_ = Specification::Int64Parameter::defaultvalue(int64Parameter);
  if ((shouldBePositive) && ((long)err.field_2._8_8_ < 1)) {
    std::__cxx11::to_string(&local_d0,err.field_2._8_8_);
    std::operator+(&local_b0,"Default Value (",&local_d0);
    std::operator+(&local_90,&local_b0,") for \'");
    std::operator+(&local_70,&local_90,parameterName);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   &local_70,"\' expected to be a positive value.");
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,(string *)local_50);
    std::__cxx11::string::~string((string *)local_50);
    return __return_storage_ptr__;
  }
  bVar4 = Specification::Int64Parameter::has_set(int64Parameter);
  if (bVar4) {
    bVar4 = false;
    this = Specification::Int64Parameter::set(int64Parameter);
    this_00 = Specification::Int64Set::values(this);
    __end2 = google::protobuf::RepeatedField<long>::begin(this_00);
    plVar5 = google::protobuf::RepeatedField<long>::end(this_00);
    for (; __end2 != plVar5; __end2 = __end2 + 1) {
      err_1.field_2._8_8_ = __end2;
      if (*__end2 == err.field_2._8_8_) {
        bVar4 = true;
        break;
      }
      if ((*__end2 < 1) && (shouldBePositive)) {
        psVar1 = (string *)((long)&err_2.field_2 + 8);
        std::__cxx11::to_string(psVar1,*__end2);
        std::operator+(&local_180,"Non-positive value (",psVar1);
        std::operator+(&local_160,&local_180,") in Allowed Values Set for \'");
        std::operator+(&local_140,&local_160,parameterName);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_120,&local_140,"\' is not allowed.");
        std::__cxx11::string::~string((string *)&local_140);
        std::__cxx11::string::~string((string *)&local_160);
        std::__cxx11::string::~string((string *)&local_180);
        std::__cxx11::string::~string((string *)(err_2.field_2._M_local_buf + 8));
        Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,
                       (string *)local_120);
        std::__cxx11::string::~string((string *)local_120);
        return __return_storage_ptr__;
      }
    }
    if (!bVar4) {
      std::__cxx11::to_string((string *)&range,err.field_2._8_8_);
      std::operator+(&local_220,"Specified Default Value (",(string *)&range);
      std::operator+(&local_200,&local_220,") not found in Allowed Values Set for \'");
      std::operator+(&local_1e0,&local_200,parameterName);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0,
                     &local_1e0,"\'");
      std::__cxx11::string::~string((string *)&local_1e0);
      std::__cxx11::string::~string((string *)&local_200);
      std::__cxx11::string::~string((string *)&local_220);
      std::__cxx11::string::~string((string *)&range);
      Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,
                     (string *)local_1c0);
      std::__cxx11::string::~string((string *)local_1c0);
      return __return_storage_ptr__;
    }
  }
  else {
    bVar4 = Specification::Int64Parameter::has_range(int64Parameter);
    if (bVar4) {
      err_3.field_2._8_8_ = Specification::Int64Parameter::range(int64Parameter);
      iVar6 = Specification::Int64Range::minvalue((Int64Range *)err_3.field_2._8_8_);
      if ((iVar6 < 1) && (shouldBePositive)) {
        iVar6 = Specification::Int64Range::minvalue((Int64Range *)err_3.field_2._8_8_);
        psVar1 = (string *)((long)&err_4.field_2 + 8);
        std::__cxx11::to_string(psVar1,iVar6);
        std::operator+(&local_2c8,"Non-positive min value (",psVar1);
        std::operator+(&local_2a8,&local_2c8,") in Allowed Value Range for \'");
        std::operator+(&local_288,&local_2a8,parameterName);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_268,&local_288,"\' is not allowed.");
        std::__cxx11::string::~string((string *)&local_288);
        std::__cxx11::string::~string((string *)&local_2a8);
        std::__cxx11::string::~string((string *)&local_2c8);
        std::__cxx11::string::~string((string *)(err_4.field_2._M_local_buf + 8));
        Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,
                       (string *)local_268);
        std::__cxx11::string::~string((string *)local_268);
        return __return_storage_ptr__;
      }
      iVar6 = Specification::Int64Range::maxvalue((Int64Range *)err_3.field_2._8_8_);
      uVar2 = err.field_2._8_8_;
      if ((iVar6 < 1) && (shouldBePositive)) {
        iVar6 = Specification::Int64Range::maxvalue((Int64Range *)err_3.field_2._8_8_);
        psVar1 = (string *)((long)&err_5.field_2 + 8);
        std::__cxx11::to_string(psVar1,iVar6);
        std::operator+(&local_368,"Non-positive max value (",psVar1);
        std::operator+(&local_348,&local_368,") in Allowed Value Range for \'");
        std::operator+(&local_328,&local_348,parameterName);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_308,&local_328,"\' is not allowed.");
        std::__cxx11::string::~string((string *)&local_328);
        std::__cxx11::string::~string((string *)&local_348);
        std::__cxx11::string::~string((string *)&local_368);
        std::__cxx11::string::~string((string *)(err_5.field_2._M_local_buf + 8));
        Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,
                       (string *)local_308);
        std::__cxx11::string::~string((string *)local_308);
        return __return_storage_ptr__;
      }
      iVar6 = Specification::Int64Range::minvalue((Int64Range *)err_3.field_2._8_8_);
      uVar3 = err.field_2._8_8_;
      if (((long)uVar2 < iVar6) ||
         (iVar6 = Specification::Int64Range::maxvalue((Int64Range *)err_3.field_2._8_8_),
         iVar6 < (long)uVar3)) {
        psVar1 = (string *)((long)&err_6.field_2 + 8);
        std::__cxx11::to_string(psVar1,err.field_2._8_8_);
        std::operator+(&local_408,"Specified Default Value (",psVar1);
        std::operator+(&local_3e8,&local_408,") out of Allowed Value Range for \'");
        std::operator+(&local_3c8,&local_3e8,parameterName);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_3a8,&local_3c8,"\'");
        std::__cxx11::string::~string((string *)&local_3c8);
        std::__cxx11::string::~string((string *)&local_3e8);
        std::__cxx11::string::~string((string *)&local_408);
        std::__cxx11::string::~string((string *)(err_6.field_2._M_local_buf + 8));
        Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,
                       (string *)local_3a8);
        std::__cxx11::string::~string((string *)local_3a8);
        return __return_storage_ptr__;
      }
      iVar6 = Specification::Int64Range::minvalue((Int64Range *)err_3.field_2._8_8_);
      iVar7 = Specification::Int64Range::maxvalue((Int64Range *)err_3.field_2._8_8_);
      if (iVar7 < iVar6) {
        std::__cxx11::to_string(&local_4c8,err.field_2._8_8_);
        std::operator+(&local_4a8,"Specified minimum value (",&local_4c8);
        std::operator+(&local_488,&local_4a8,") greater than maximum value for \'");
        std::operator+(&local_468,&local_488,parameterName);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_448,&local_468,"\'");
        std::__cxx11::string::~string((string *)&local_468);
        std::__cxx11::string::~string((string *)&local_488);
        std::__cxx11::string::~string((string *)&local_4a8);
        std::__cxx11::string::~string((string *)&local_4c8);
        Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,
                       (string *)local_448);
        std::__cxx11::string::~string((string *)local_448);
        return __return_storage_ptr__;
      }
    }
  }
  Result::Result(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Result CoreML::validateInt64Parameter(const std::string& parameterName, const Specification::Int64Parameter& int64Parameter, bool shouldBePositive) {

    const ::google::protobuf::int64 defaultValue = int64Parameter.defaultvalue();

    if (shouldBePositive) {
        if (defaultValue <= 0) {
            std::string err = "Default Value (" + std::to_string(defaultValue) + ") for '" + parameterName + "' expected to be a positive value.";
            return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
        }
    }

    if (int64Parameter.has_set()) {
        bool valueFoundInSet = false;
        for (const auto &value : int64Parameter.set().values()) {
            if (value == defaultValue) {
                valueFoundInSet = true;
                break;
            }
            if (value <= 0 && shouldBePositive) {
                std::string err = "Non-positive value (" + std::to_string(value) + ") in Allowed Values Set for '" + parameterName + "' is not allowed.";
                return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
            }
        }
        if (false == valueFoundInSet) {
            std::string err = "Specified Default Value (" + std::to_string(defaultValue) + ") not found in Allowed Values Set for '" + parameterName + "'";
            return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
        }
    }
    else if (int64Parameter.has_range()) {
        const Specification::Int64Range& range = int64Parameter.range();

        if (range.minvalue() <= 0 && shouldBePositive) {
            std::string err = "Non-positive min value (" + std::to_string(range.minvalue()) + ") in Allowed Value Range for '" + parameterName + "' is not allowed.";
            return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
        }

        if (range.maxvalue() <= 0 && shouldBePositive) {
            std::string err = "Non-positive max value (" + std::to_string(range.maxvalue()) + ") in Allowed Value Range for '" + parameterName + "' is not allowed.";
            return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
        }

        if (defaultValue < range.minvalue() || defaultValue > range.maxvalue()) {
            std::string err = "Specified Default Value (" + std::to_string(defaultValue) + ") out of Allowed Value Range for '" + parameterName + "'";
            return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
        }

        if (range.minvalue() > range.maxvalue()) {
            std::string err = "Specified minimum value (" + std::to_string(defaultValue) + ") greater than maximum value for '" + parameterName + "'";
            return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);

        }
    }

    return Result();
}